

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockUnix.cxx
# Opt level: O0

cmFileLockResult __thiscall cmFileLock::LockWithTimeout(cmFileLock *this,unsigned_long seconds)

{
  int iVar1;
  int *piVar2;
  cmFileLockResult cVar3;
  unsigned_long local_20;
  unsigned_long seconds_local;
  cmFileLock *this_local;
  
  local_20 = seconds;
  while( true ) {
    iVar1 = LockFile(this,6,1);
    if (iVar1 != -1) {
      cVar3 = cmFileLockResult::MakeOk();
      return cVar3;
    }
    piVar2 = __errno_location();
    if ((*piVar2 != 0xd) && (piVar2 = __errno_location(), *piVar2 != 0xb)) break;
    if (local_20 == 0) {
      cVar3 = cmFileLockResult::MakeTimeout();
      return cVar3;
    }
    local_20 = local_20 - 1;
    cmsys::SystemTools::Delay(1000);
  }
  cVar3 = cmFileLockResult::MakeSystem();
  return cVar3;
}

Assistant:

cmFileLockResult cmFileLock::LockWithTimeout(unsigned long seconds)
{
  while (true) {
    if (this->LockFile(F_SETLK, F_WRLCK) == -1) {
      if (errno != EACCES && errno != EAGAIN) {
        return cmFileLockResult::MakeSystem();
      }
    } else {
      return cmFileLockResult::MakeOk();
    }
    if (seconds == 0) {
      return cmFileLockResult::MakeTimeout();
    }
    --seconds;
    cmSystemTools::Delay(1000);
  }
}